

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void arena_new_create_background_thread(tsdn_t *tsdn,uint ind)

{
  _Bool _Var1;
  uint in_ESI;
  tsd_t *in_RDI;
  
  if ((in_ESI != 0) && (_Var1 = duckdb_je_background_thread_create(in_RDI,in_ESI), _Var1)) {
    duckdb_je_malloc_printf
              ("<jemalloc>: error in background thread creation for arena %u. Abort.\n",
               (ulong)in_ESI);
    abort();
  }
  return;
}

Assistant:

static void
arena_new_create_background_thread(tsdn_t *tsdn, unsigned ind) {
	if (ind == 0) {
		return;
	}

	if (have_background_thread) {
		if (background_thread_create(tsdn_tsd(tsdn), ind)) {
			malloc_printf("<jemalloc>: error in background thread "
				      "creation for arena %u. Abort.\n", ind);
			abort();
		}
	}
}